

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O2

void getUnscaledInfeasibilities
               (HighsOptions *options,HighsScale *scale,SimplexBasis *basis,HighsSimplexInfo *info,
               HighsInfo *highs_info)

{
  HighsInt *pHVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  ulong uVar11;
  HighsInt ix;
  HighsInt iVar;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar13 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
  lVar12 = 0;
  while( true ) {
    iVar3 = scale->num_col;
    uVar11 = (ulong)scale->num_row;
    if ((long)(uVar11 + (long)iVar3) <= lVar12) break;
    if ((basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
        .super__Vector_impl_data._M_start[lVar12] != '\0') {
      dVar14 = (info->workLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      dVar15 = (info->workUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      if ((dVar14 != dVar15) || (NAN(dVar14) || NAN(dVar15))) {
        if (lVar12 < iVar3) {
          dVar17 = 1.0 / ((scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12] / scale->cost);
        }
        else {
          dVar17 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)lVar12 - iVar3] * scale->cost;
        }
        dVar17 = dVar17 * (info->workDual_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12];
        bVar10 = highs_isInfinity(-dVar14);
        if (bVar10) {
          bVar10 = highs_isInfinity(dVar15);
          if (!bVar10) goto LAB_0034d921;
          dVar17 = ABS(dVar17);
        }
        else {
LAB_0034d921:
          dVar17 = dVar17 * (double)-(int)(basis->nonbasicMove_).
                                          super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar12];
        }
        if (0.0 < dVar17) {
          if (dVar13 <= dVar17) {
            pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
            *pHVar1 = *pHVar1 + 1;
          }
          dVar14 = (highs_info->super_HighsInfoStruct).max_dual_infeasibility;
          if (dVar14 <= dVar17) {
            dVar14 = dVar17;
          }
          (highs_info->super_HighsInfoStruct).max_dual_infeasibility = dVar14;
          (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
               dVar17 + (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities;
        }
      }
    }
    lVar12 = lVar12 + 1;
  }
  dVar13 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
  dVar14 = (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities;
  piVar4 = (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (info->baseLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (info->baseUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (info->baseValue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = 0;
  do {
    if ((int)uVar11 <= lVar12) {
      setSolutionStatus(highs_info);
      return;
    }
    iVar3 = piVar4[lVar12];
    if (iVar3 < scale->num_col) {
      dVar15 = pdVar5[iVar3];
    }
    else {
      dVar15 = 1.0 / pdVar6[iVar3 - scale->num_col];
    }
    dVar17 = pdVar7[lVar12] * dVar15;
    dVar16 = pdVar9[lVar12] * dVar15;
    if (dVar17 - dVar2 <= dVar16) {
      dVar15 = dVar15 * pdVar8[lVar12];
      if (dVar2 + dVar15 < dVar16) {
        dVar17 = dVar16 - dVar15;
        goto LAB_0034da2d;
      }
    }
    else {
      dVar17 = dVar17 - dVar16;
LAB_0034da2d:
      if (0.0 < dVar17) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
        if (dVar13 <= dVar17) {
          dVar13 = dVar17;
        }
        (highs_info->super_HighsInfoStruct).max_primal_infeasibility = dVar13;
        dVar14 = dVar14 + dVar17;
        (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = dVar14;
        uVar11 = (ulong)(uint)scale->num_row;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void getUnscaledInfeasibilities(const HighsOptions& options,
                                const HighsScale& scale,
                                const SimplexBasis& basis,
                                const HighsSimplexInfo& info,
                                HighsInfo& highs_info) {
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  HighsInt& num_primal_infeasibilities = highs_info.num_primal_infeasibilities;
  double& max_primal_infeasibility = highs_info.max_primal_infeasibility;
  double& sum_primal_infeasibilities = highs_info.sum_primal_infeasibilities;
  HighsInt& num_dual_infeasibilities = highs_info.num_dual_infeasibilities;
  double& max_dual_infeasibility = highs_info.max_dual_infeasibility;
  double& sum_dual_infeasibilities = highs_info.sum_dual_infeasibilities;

  // Zero the counts of unscaled primal and dual infeasibilities
  num_primal_infeasibilities = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibilities = 0;
  num_dual_infeasibilities = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibilities = 0;

  double scale_mu = 1.0;
  assert(int(scale.col.size()) == scale.num_col);
  assert(int(scale.row.size()) == scale.num_row);
  for (HighsInt iVar = 0; iVar < scale.num_col + scale.num_row; iVar++) {
    // Look at the dual infeasibilities of nonbasic variables
    if (basis.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
    // No dual infeasibility for fixed rows and columns
    if (info.workLower_[iVar] == info.workUpper_[iVar]) continue;
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      assert(int(scale.col.size()) > iCol);
      scale_mu = 1 / (scale.col[iCol] / scale.cost);
    } else {
      iRow = iVar - scale.num_col;
      assert(int(scale.row.size()) > iRow);
      scale_mu = scale.row[iRow] * scale.cost;
    }
    const double dual = info.workDual_[iVar];
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double unscaled_dual = dual * scale_mu;

    double dual_infeasibility;
    if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free: any nonzero dual value is infeasible
      dual_infeasibility = fabs(unscaled_dual);
    } else {
      // Not fixed: any dual infeasibility is given by value signed by
      // nonbasicMove. This assumes that nonbasicMove=0 for fixed
      // variables
      dual_infeasibility = -basis.nonbasicMove_[iVar] * unscaled_dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= dual_feasibility_tolerance)
        num_dual_infeasibilities++;
      max_dual_infeasibility = max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibilities += dual_infeasibility;
    }
  }
  // Look at the primal infeasibilities of basic variables
  for (HighsInt ix = 0; ix < scale.num_row; ix++) {
    HighsInt iVar = basis.basicIndex_[ix];
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      scale_mu = scale.col[iCol];
    } else {
      iRow = iVar - scale.num_col;
      scale_mu = 1 / scale.row[iRow];
    }
    double unscaled_lower = info.baseLower_[ix] * scale_mu;
    double unscaled_value = info.baseValue_[ix] * scale_mu;
    double unscaled_upper = info.baseUpper_[ix] * scale_mu;
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (unscaled_value < unscaled_lower - primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_lower - unscaled_value;
    } else if (unscaled_value > unscaled_upper + primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_value - unscaled_upper;
    }
    if (primal_infeasibility > 0) {
      num_primal_infeasibilities++;
      max_primal_infeasibility =
          max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibilities += primal_infeasibility;
    }
  }
  setSolutionStatus(highs_info);
}